

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorRegressor::SupportVectorRegressor
          (SupportVectorRegressor *this,SupportVectorRegressor *from)

{
  bool bVar1;
  SupportVectorsCase SVar2;
  InternalMetadataWithArenaLite *this_00;
  Kernel *this_01;
  Coefficients *this_02;
  SparseSupportVectors *this_03;
  SparseSupportVectors *from_00;
  DenseSupportVectors *this_04;
  DenseSupportVectors *from_01;
  SupportVectorRegressor *from_local;
  SupportVectorRegressor *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SupportVectorRegressor_00575478;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  SupportVectorsUnion::SupportVectorsUnion((SupportVectorsUnion *)&this->supportVectors_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  bVar1 = has_kernel(from);
  if (bVar1) {
    this_01 = (Kernel *)operator_new(0x20);
    Kernel::Kernel(this_01,from->kernel_);
    this->kernel_ = this_01;
  }
  else {
    this->kernel_ = (Kernel *)0x0;
  }
  bVar1 = has_coefficients(from);
  if (bVar1) {
    this_02 = (Coefficients *)operator_new(0x28);
    Coefficients::Coefficients(this_02,from->coefficients_);
    this->coefficients_ = this_02;
  }
  else {
    this->coefficients_ = (Coefficients *)0x0;
  }
  this->rho_ = from->rho_;
  clear_has_supportVectors(this);
  SVar2 = supportVectors_case(from);
  if (SVar2 != SUPPORTVECTORS_NOT_SET) {
    if (SVar2 == kSparseSupportVectors) {
      this_03 = mutable_sparsesupportvectors(this);
      from_00 = sparsesupportvectors(from);
      SparseSupportVectors::MergeFrom(this_03,from_00);
    }
    else if (SVar2 == kDenseSupportVectors) {
      this_04 = mutable_densesupportvectors(this);
      from_01 = densesupportvectors(from);
      DenseSupportVectors::MergeFrom(this_04,from_01);
    }
  }
  return;
}

Assistant:

SupportVectorRegressor::SupportVectorRegressor(const SupportVectorRegressor& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_kernel()) {
    kernel_ = new ::CoreML::Specification::Kernel(*from.kernel_);
  } else {
    kernel_ = NULL;
  }
  if (from.has_coefficients()) {
    coefficients_ = new ::CoreML::Specification::Coefficients(*from.coefficients_);
  } else {
    coefficients_ = NULL;
  }
  rho_ = from.rho_;
  clear_has_supportVectors();
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SupportVectorRegressor)
}